

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make_range_vector.hpp
# Opt level: O2

vector<boost::iterator_range<std::_List_iterator<char>_>,_std::allocator<boost::iterator_range<std::_List_iterator<char>_>_>_>
* __thiscall
burst::make_range_vector_t::operator()
          (vector<boost::iterator_range<std::_List_iterator<char>_>,_std::allocator<boost::iterator_range<std::_List_iterator<char>_>_>_>
           *__return_storage_ptr__,make_range_vector_t *this,
          list<char,_std::allocator<char>_> *collections,
          list<char,_std::allocator<char>_> *collections_1)

{
  initializer_list<boost::iterator_range<std::_List_iterator<char>_>_> values;
  _List_node_base *local_28;
  list<char,_std::allocator<char>_> *local_20;
  _List_node_base *local_18;
  list<char,_std::allocator<char>_> *local_10;
  
  local_28 = (collections->super__List_base<char,_std::allocator<char>_>)._M_impl._M_node.
             super__List_node_base._M_next;
  local_18 = (collections_1->super__List_base<char,_std::allocator<char>_>)._M_impl._M_node.
             super__List_node_base._M_next;
  values._M_len = (size_type)collections_1;
  values._M_array = (iterator)0x2;
  local_20 = collections;
  local_10 = collections_1;
  make_sequence_container<std::vector,_boost::iterator_range<std::_List_iterator<char>_>_>
            (__return_storage_ptr__,(burst *)&local_28,values);
  return __return_storage_ptr__;
}

Assistant:

auto operator () (Collections & ... collections) const
        {
            return make_vector({boost::make_iterator_range(collections)...});
        }